

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3AddPrimaryKey(Parse *pParse,ExprList *pList,int onError,int autoInc,int sortOrder)

{
  Table *pTVar1;
  int iVar2;
  Index *pIVar3;
  Index *p;
  int i;
  int iCol;
  char *zType;
  Table *pTab;
  int sortOrder_local;
  int autoInc_local;
  int onError_local;
  ExprList *pList_local;
  Parse *pParse_local;
  
  pTVar1 = pParse->pNewTable;
  _i = (char *)0x0;
  p._4_4_ = -1;
  _autoInc_local = pList;
  if ((pTVar1 != (Table *)0x0) && (pParse->declareVtab == '\0')) {
    if ((pTVar1->tabFlags & 4) == 0) {
      pTVar1->tabFlags = pTVar1->tabFlags | 4;
      if (pList == (ExprList *)0x0) {
        p._4_4_ = pTVar1->nCol + -1;
        pTVar1->aCol[p._4_4_].colFlags = pTVar1->aCol[p._4_4_].colFlags | 1;
      }
      else {
        for (p._0_4_ = 0; (int)p < pList->nExpr; p._0_4_ = (int)p + 1) {
          p._4_4_ = 0;
          while ((p._4_4_ < pTVar1->nCol &&
                 (iVar2 = sqlite3_stricmp(pList->a[(int)p].zName,pTVar1->aCol[p._4_4_].zName),
                 iVar2 != 0))) {
            p._4_4_ = p._4_4_ + 1;
          }
          if (p._4_4_ < pTVar1->nCol) {
            pTVar1->aCol[p._4_4_].colFlags = pTVar1->aCol[p._4_4_].colFlags | 1;
          }
        }
        if (1 < pList->nExpr) {
          p._4_4_ = -1;
        }
      }
      if ((-1 < p._4_4_) && (p._4_4_ < pTVar1->nCol)) {
        _i = pTVar1->aCol[p._4_4_].zType;
      }
      if (((_i == (char *)0x0) || (iVar2 = sqlite3_stricmp(_i,"INTEGER"), iVar2 != 0)) ||
         (sortOrder != 0)) {
        if (autoInc == 0) {
          pIVar3 = sqlite3CreateIndex(pParse,(Token *)0x0,(Token *)0x0,(SrcList *)0x0,pList,onError,
                                      (Token *)0x0,(Token *)0x0,sortOrder,0);
          if (pIVar3 != (Index *)0x0) {
            pIVar3->field_0x4f = pIVar3->field_0x4f & 0xfc | 2;
          }
          _autoInc_local = (ExprList *)0x0;
        }
        else {
          sqlite3ErrorMsg(pParse,"AUTOINCREMENT is only allowed on an INTEGER PRIMARY KEY");
        }
      }
      else {
        pTVar1->iPKey = (i16)p._4_4_;
        pTVar1->keyConf = (u8)onError;
        pTVar1->tabFlags = pTVar1->tabFlags | (byte)(autoInc << 3);
      }
    }
    else {
      sqlite3ErrorMsg(pParse,"table \"%s\" has more than one primary key",pTVar1->zName);
    }
  }
  sqlite3ExprListDelete(pParse->db,_autoInc_local);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddPrimaryKey(
  Parse *pParse,    /* Parsing context */
  ExprList *pList,  /* List of field names to be indexed */
  int onError,      /* What to do with a uniqueness conflict */
  int autoInc,      /* True if the AUTOINCREMENT keyword is present */
  int sortOrder     /* SQLITE_SO_ASC or SQLITE_SO_DESC */
){
  Table *pTab = pParse->pNewTable;
  char *zType = 0;
  int iCol = -1, i;
  if( pTab==0 || IN_DECLARE_VTAB ) goto primary_key_exit;
  if( pTab->tabFlags & TF_HasPrimaryKey ){
    sqlite3ErrorMsg(pParse, 
      "table \"%s\" has more than one primary key", pTab->zName);
    goto primary_key_exit;
  }
  pTab->tabFlags |= TF_HasPrimaryKey;
  if( pList==0 ){
    iCol = pTab->nCol - 1;
    pTab->aCol[iCol].colFlags |= COLFLAG_PRIMKEY;
  }else{
    for(i=0; i<pList->nExpr; i++){
      for(iCol=0; iCol<pTab->nCol; iCol++){
        if( sqlite3StrICmp(pList->a[i].zName, pTab->aCol[iCol].zName)==0 ){
          break;
        }
      }
      if( iCol<pTab->nCol ){
        pTab->aCol[iCol].colFlags |= COLFLAG_PRIMKEY;
      }
    }
    if( pList->nExpr>1 ) iCol = -1;
  }
  if( iCol>=0 && iCol<pTab->nCol ){
    zType = pTab->aCol[iCol].zType;
  }
  if( zType && sqlite3StrICmp(zType, "INTEGER")==0
        && sortOrder==SQLITE_SO_ASC ){
    pTab->iPKey = iCol;
    pTab->keyConf = (u8)onError;
    assert( autoInc==0 || autoInc==1 );
    pTab->tabFlags |= autoInc*TF_Autoincrement;
  }else if( autoInc ){
#ifndef SQLITE_OMIT_AUTOINCREMENT
    sqlite3ErrorMsg(pParse, "AUTOINCREMENT is only allowed on an "
       "INTEGER PRIMARY KEY");
#endif
  }else{
    Index *p;
    p = sqlite3CreateIndex(pParse, 0, 0, 0, pList, onError, 0, 0, sortOrder, 0);
    if( p ){
      p->autoIndex = 2;
    }
    pList = 0;
  }

primary_key_exit:
  sqlite3ExprListDelete(pParse->db, pList);
  return;
}